

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

void __thiscall
Enhedron::Test::Impl::Impl_Results::HumanResults::failByException
          (HumanResults *this,NameStack *context,string *given,NameStack *whenStack,exception *e)

{
  size_t indent;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  char *pcVar3;
  exception *e_local;
  NameStack *whenStack_local;
  string *given_local;
  NameStack *context_local;
  HumanResults *this_local;
  
  indent = whenDepth(this);
  HumanResults::indent(this,indent);
  pbVar1 = Enhedron::Impl::Util::Out<std::basic_ostream<char,_std::char_traits<char>_>_>::operator*
                     (&this->output_);
  poVar2 = ::std::operator<<(pbVar1,"TEST FAILED WITH EXCEPTION: ");
  pcVar3 = (char *)(**(code **)(*(long *)e + 0x10))();
  poVar2 = ::std::operator<<(poVar2,pcVar3);
  ::std::ostream::operator<<(poVar2,::std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void failByException(const NameStack& context,
                                     const string& given,
                                     const NameStack& whenStack,
                                     const exception& e) override {
            indent(whenDepth());
            (*output_) << "TEST FAILED WITH EXCEPTION: " << e.what() << endl;
        }